

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXRFromMemory(float *out_rgba,uchar *memory,char **err)

{
  int iVar1;
  int local_10ac;
  int local_10a8;
  int i;
  int c;
  int idxA;
  int idxB;
  int idxG;
  int idxR;
  int ret;
  EXRImage exrImage;
  char **err_local;
  uchar *memory_local;
  float *out_rgba_local;
  
  if ((out_rgba == (float *)0x0) || (memory == (uchar *)0x0)) {
    if (err != (char **)0x0) {
      *err = "Invalid argument.\n";
    }
    out_rgba_local._4_4_ = -1;
  }
  else {
    exrImage._4192_8_ = err;
    InitEXRImage((EXRImage *)&idxR);
    out_rgba_local._4_4_ =
         LoadMultiChannelEXRFromMemory((EXRImage *)&idxR,memory,(char **)exrImage._4192_8_);
    if (out_rgba_local._4_4_ == 0) {
      idxB = -1;
      idxA = -1;
      c = -1;
      i = -1;
      for (local_10a8 = 0; local_10a8 < exrImage.custom_attributes[0x7f].value._4_4_;
          local_10a8 = local_10a8 + 1) {
        iVar1 = strcmp(*(char **)(exrImage._4096_8_ + (long)local_10a8 * 8),"R");
        if (iVar1 == 0) {
          idxB = local_10a8;
        }
        else {
          iVar1 = strcmp(*(char **)(exrImage._4096_8_ + (long)local_10a8 * 8),"G");
          if (iVar1 == 0) {
            idxA = local_10a8;
          }
          else {
            iVar1 = strcmp(*(char **)(exrImage._4096_8_ + (long)local_10a8 * 8),"B");
            if (iVar1 == 0) {
              c = local_10a8;
            }
            else {
              iVar1 = strcmp(*(char **)(exrImage._4096_8_ + (long)local_10a8 * 8),"A");
              if (iVar1 == 0) {
                i = local_10a8;
              }
            }
          }
        }
      }
      if (idxB == -1) {
        if (exrImage._4192_8_ != 0) {
          *(char **)exrImage._4192_8_ = "R channel not found\n";
        }
        out_rgba_local._4_4_ = -1;
      }
      else if (idxA == -1) {
        if (exrImage._4192_8_ != 0) {
          *(char **)exrImage._4192_8_ = "G channel not found\n";
        }
        out_rgba_local._4_4_ = -1;
      }
      else if (c == -1) {
        if (exrImage._4192_8_ != 0) {
          *(char **)exrImage._4192_8_ = "B channel not found\n";
        }
        out_rgba_local._4_4_ = -1;
      }
      else {
        for (local_10ac = 0;
            local_10ac < (int)exrImage.requested_pixel_types * exrImage.requested_pixel_types._4_4_;
            local_10ac = local_10ac + 1) {
          out_rgba[local_10ac << 2] =
               *(float *)(exrImage.channel_names[idxB] + (long)local_10ac * 4);
          out_rgba[local_10ac * 4 + 1] =
               *(float *)(exrImage.channel_names[idxA] + (long)local_10ac * 4);
          out_rgba[local_10ac * 4 + 2] =
               *(float *)(exrImage.channel_names[c] + (long)local_10ac * 4);
          if (i < 1) {
            out_rgba[local_10ac * 4 + 3] = 1.0;
          }
          else {
            out_rgba[local_10ac * 4 + 3] =
                 *(float *)(exrImage.channel_names[i] + (long)local_10ac * 4);
          }
        }
        out_rgba_local._4_4_ = 0;
      }
    }
  }
  return out_rgba_local._4_4_;
}

Assistant:

int LoadEXRFromMemory(float *out_rgba, const unsigned char *memory,
                      const char **err) {

  if (out_rgba == NULL || memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }
    return -1;
  }

  EXRImage exrImage;
  InitEXRImage(&exrImage);
  int ret = LoadMultiChannelEXRFromMemory(&exrImage, memory, err);
  if (ret != 0) {
    return ret;
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exrImage.num_channels; c++) {
    if (strcmp(exrImage.channel_names[c], "R") == 0) {
      idxR = c;
    } else if (strcmp(exrImage.channel_names[c], "G") == 0) {
      idxG = c;
    } else if (strcmp(exrImage.channel_names[c], "B") == 0) {
      idxB = c;
    } else if (strcmp(exrImage.channel_names[c], "A") == 0) {
      idxA = c;
    }
  }

  if (idxR == -1) {
    if (err) {
      (*err) = "R channel not found\n";
    }

    // @todo { free exrImage }
    return -1;
  }

  if (idxG == -1) {
    if (err) {
      (*err) = "G channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  if (idxB == -1) {
    if (err) {
      (*err) = "B channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  // Assume `out_rgba` have enough memory allocated.
  for (int i = 0; i < exrImage.width * exrImage.height; i++) {
    out_rgba[4 * i + 0] = reinterpret_cast<float **>(exrImage.images)[idxR][i];
    out_rgba[4 * i + 1] = reinterpret_cast<float **>(exrImage.images)[idxG][i];
    out_rgba[4 * i + 2] = reinterpret_cast<float **>(exrImage.images)[idxB][i];
    if (idxA > 0) {
      out_rgba[4 * i + 3] =
          reinterpret_cast<float **>(exrImage.images)[idxA][i];
    } else {
      out_rgba[4 * i + 3] = 1.0;
    }
  }

  return 0;
}